

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O2

void duckdb::DecimalToString::FormatDecimal<short>
               (short value,uint8_t width,uint8_t scale,char *dst,idx_t len)

{
  ushort value_00;
  char *pcVar1;
  char *ptr;
  char *pcVar2;
  
  if (value < 0) {
    value = -value;
    *dst = '-';
  }
  ptr = dst + len;
  value_00 = value;
  if (scale != '\0') {
    value_00 = (ushort)value / *(ushort *)(NumericHelper::POWERS_OF_TEN + (ulong)scale * 8);
    pcVar1 = NumericHelper::FormatUnsigned<unsigned_short>
                       ((ushort)value % *(ushort *)(NumericHelper::POWERS_OF_TEN + (ulong)scale * 8)
                        ,ptr);
    pcVar2 = ptr + -(ulong)scale;
    while (ptr = pcVar1 + -1, pcVar2 < pcVar1) {
      *ptr = '0';
      pcVar1 = ptr;
    }
    *ptr = '.';
    if (width <= scale) {
      return;
    }
  }
  NumericHelper::FormatUnsigned<unsigned_short>(value_00,ptr);
  return;
}

Assistant:

static void FormatDecimal(SIGNED value, uint8_t width, uint8_t scale, char *dst, idx_t len) {
		using UNSIGNED = typename MakeUnsigned<SIGNED>::type;
		char *end = dst + len;
		if (value < 0) {
			value = -value;
			*dst = '-';
		}
		if (scale == 0) {
			NumericHelper::FormatUnsigned<UNSIGNED>(UnsafeNumericCast<UNSIGNED>(value), end);
			return;
		}
		// we write two numbers:
		// the numbers BEFORE the decimal (major)
		// and the numbers AFTER the decimal (minor)
		auto minor =
		    UnsafeNumericCast<UNSIGNED>(value) % UnsafeNumericCast<UNSIGNED>(NumericHelper::POWERS_OF_TEN[scale]);
		auto major =
		    UnsafeNumericCast<UNSIGNED>(value) / UnsafeNumericCast<UNSIGNED>(NumericHelper::POWERS_OF_TEN[scale]);
		// write the number after the decimal
		dst = NumericHelper::FormatUnsigned<UNSIGNED>(UnsafeNumericCast<UNSIGNED>(minor), end);
		// (optionally) pad with zeros and add the decimal point
		while (dst > (end - scale)) {
			*--dst = '0';
		}
		*--dst = '.';
		// now write the part before the decimal
		D_ASSERT(width > scale || major == 0);
		if (width > scale) {
			// there are numbers after the comma
			dst = NumericHelper::FormatUnsigned<UNSIGNED>(UnsafeNumericCast<UNSIGNED>(major), dst);
		}
	}